

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::retranslateWindowTitle(QFileDialogPrivate *this)

{
  long lVar1;
  AcceptMode AVar2;
  FileMode FVar3;
  QWidget *this_00;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  FileMode fileMode;
  QFileDialog *q;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QWidget *in_stack_ffffffffffffff30;
  QWidget *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff50;
  byte local_99;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(in_RDI);
  local_99 = 1;
  if ((in_RDI->useDefaultCaption & 1U) != 0) {
    in_stack_ffffffffffffff50 = (QWidget *)&in_RDI->setWindowTitle;
    QWidget::windowTitle(in_stack_ffffffffffffff38);
    local_99 = ::operator!=((QString *)in_stack_ffffffffffffff30,
                            (QString *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    QString::~QString((QString *)0x74fd5e);
  }
  if ((local_99 & 1) == 0) {
    AVar2 = QFileDialog::acceptMode((QFileDialog *)in_stack_ffffffffffffff30);
    if (AVar2 == AcceptOpen) {
      FVar3 = QFileDialog::fileMode((QFileDialog *)in_stack_ffffffffffffff30);
      if (FVar3 == Directory) {
        QFileDialog::tr((char *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff2c);
        QWidget::setWindowTitle
                  (in_stack_ffffffffffffff50,(QString *)CONCAT17(local_99,in_stack_ffffffffffffff48)
                  );
        QString::~QString((QString *)0x74fddb);
        this_00 = in_stack_ffffffffffffff38;
      }
      else {
        QFileDialog::tr((char *)this_00,(char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c)
        ;
        QWidget::setWindowTitle
                  (in_stack_ffffffffffffff50,(QString *)CONCAT17(local_99,in_stack_ffffffffffffff48)
                  );
        QString::~QString((QString *)0x74fe23);
      }
    }
    else {
      QFileDialog::tr((char *)in_stack_ffffffffffffff38,(char *)this_00,in_stack_ffffffffffffff2c);
      QWidget::setWindowTitle
                (in_stack_ffffffffffffff50,(QString *)CONCAT17(local_99,in_stack_ffffffffffffff48));
      QString::~QString((QString *)0x74fe62);
      in_stack_ffffffffffffff30 = this_00;
      this_00 = in_stack_ffffffffffffff38;
    }
    QWidget::windowTitle(this_00);
    QString::operator=((QString *)in_stack_ffffffffffffff30,
                       (QString *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QString::~QString((QString *)0x74fe91);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::retranslateWindowTitle()
{
    Q_Q(QFileDialog);
    if (!useDefaultCaption || setWindowTitle != q->windowTitle())
        return;
    if (q->acceptMode() == QFileDialog::AcceptOpen) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        if (fileMode == QFileDialog::Directory)
            q->setWindowTitle(QFileDialog::tr("Find Directory"));
        else
            q->setWindowTitle(QFileDialog::tr("Open"));
    } else
        q->setWindowTitle(QFileDialog::tr("Save As"));

    setWindowTitle = q->windowTitle();
}